

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase232::run(TestCase232 *this)

{
  Builder builder;
  Reader reader;
  ReaderOptions options;
  PipeWithSmallBuffer fds;
  AsyncInputStream local_210;
  FragmentingOutputStream output;
  Own<capnp::MessageReader,_std::nullptr_t> received;
  Own<kj::AsyncInputStream,_std::nullptr_t> input;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_1c0;
  SocketOutputStream rawOutput;
  Thread thread;
  AsyncIoContext ioContext;
  Builder local_158;
  Reader local_130;
  TestMessageBuilder message;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer(&fds);
  kj::setupAsyncIo();
  (**(ioContext.lowLevelProvider.ptr)->_vptr_LowLevelAsyncIoProvider)
            (&input,ioContext.lowLevelProvider.ptr,(ulong)(uint)fds.fds[0],0);
  output.inner = &rawOutput.super_OutputStream;
  rawOutput.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__FdOutputStream_00679480;
  rawOutput.fd = fds.fds[1];
  rawOutput.autoclose.fd = -1;
  output.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__ArrayOutputStream_0064f1a8;
  TestMessageBuilder::TestMessageBuilder(&message,7);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_158,(MessageBuilder *)&message);
  builder._builder.capTable = local_158._builder.capTable;
  builder._builder.segment = local_158._builder.segment;
  builder._builder.data = local_158._builder.data;
  builder._builder.pointers = local_158._builder.pointers;
  builder._builder.dataSize = local_158._builder.dataSize;
  builder._builder.pointerCount = local_158._builder.pointerCount;
  builder._builder._38_2_ = local_158._builder._38_2_;
  initTestMessage(builder);
  local_1c0.ptr = (Iface *)operator_new(0x18);
  (local_1c0.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0064f2c8;
  local_1c0.ptr[1]._vptr_Iface = (_func_int **)&output;
  local_1c0.ptr[2]._vptr_Iface = (_func_int **)&message;
  local_1c0.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<capnp::_::(anonymous_namespace)::TestCase232::run()::$_0>>
        ::instance;
  kj::Thread::Thread(&thread,(Function<void_()> *)&local_1c0);
  kj::Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_1c0);
  options._8_8_ = 0x800000;
  options.traversalLimitInWords = (uint64_t)input.ptr;
  readMessage(&local_210,options,(ArrayPtr<capnp::word>)ZEXT816(0x40));
  kj::Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_> *)&received,&local_210);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_210);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>(&local_130,received.ptr);
  reader._reader.capTable = local_130._reader.capTable;
  reader._reader.segment = local_130._reader.segment;
  reader._reader.data = local_130._reader.data;
  reader._reader.pointers = local_130._reader.pointers;
  reader._reader.dataSize = local_130._reader.dataSize;
  reader._reader.pointerCount = local_130._reader.pointerCount;
  reader._reader._38_2_ = local_130._reader._38_2_;
  reader._reader.nestingLimit = local_130._reader.nestingLimit;
  reader._reader._44_4_ = local_130._reader._44_4_;
  checkTestMessage(reader);
  kj::Own<capnp::MessageReader,_std::nullptr_t>::dispose(&received);
  kj::Thread::~Thread(&thread);
  TestMessageBuilder::~TestMessageBuilder(&message);
  kj::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&output);
  kj::FdOutputStream::~FdOutputStream(&rawOutput);
  kj::Own<kj::AsyncInputStream,_std::nullptr_t>::dispose(&input);
  kj::AsyncIoContext::~AsyncIoContext(&ioContext);
  PipeWithSmallBuffer::~PipeWithSmallBuffer(&fds);
  return;
}

Assistant:

TEST(SerializeAsyncTest, ParseAsyncOddSegmentCount) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto input = ioContext.lowLevelProvider->wrapInputFd(fds[0]);
  SocketOutputStream rawOutput(fds[1]);
  FragmentingOutputStream output(rawOutput);

  TestMessageBuilder message(7);
  initTestMessage(message.getRoot<TestAllTypes>());

  kj::Thread thread([&]() {
    writeMessage(output, message);
  });

  auto received = readMessage(*input).wait(ioContext.waitScope);

  checkTestMessage(received->getRoot<TestAllTypes>());
}